

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O2

void on_waitcnt_updated(void)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = (bus->WAITCNT).raw;
  nonsequential_byte_half_cycles[8] = *(int *)(&DAT_00123fac + (uVar1 & 0xc));
  nonsequential_byte_half_cycles[9] = nonsequential_byte_half_cycles[8];
  sequential_byte_half_cycles[8] = ((uVar1 & 0x10) == 0) + 1;
  sequential_byte_half_cycles[9] = sequential_byte_half_cycles[8];
  nonsequential_word_cycles[8] = nonsequential_byte_half_cycles[8] + sequential_byte_half_cycles[8];
  sequential_word_cycles[9] = sequential_byte_half_cycles[8] * 2;
  nonsequential_byte_half_cycles[10] = nonsequential_byte_half_cycles[8];
  nonsequential_byte_half_cycles[0xb] = nonsequential_byte_half_cycles[8];
  uVar2 = (uint)(-1 < (char)uVar1);
  sequential_byte_half_cycles[10] = uVar2 * 3 + 1;
  sequential_byte_half_cycles[0xb] = sequential_byte_half_cycles[10];
  nonsequential_word_cycles[10] = nonsequential_byte_half_cycles[8] + 1 + uVar2 * 3;
  sequential_word_cycles[0xb] = uVar2 * 6 + 2;
  nonsequential_byte_half_cycles[0xc] = nonsequential_byte_half_cycles[8];
  sequential_byte_half_cycles[0xc] = 1;
  if ((uVar1 >> 10 & 1) == 0) {
    sequential_byte_half_cycles[0xc] = 8;
  }
  nonsequential_byte_half_cycles[0xd] = nonsequential_byte_half_cycles[8];
  sequential_byte_half_cycles[0xd] = sequential_byte_half_cycles[0xc];
  nonsequential_word_cycles[0xc] =
       nonsequential_byte_half_cycles[8] + sequential_byte_half_cycles[0xc];
  sequential_word_cycles[0xd] = sequential_byte_half_cycles[0xc] * 2;
  nonsequential_byte_half_cycles[0xe] = nonsequential_byte_half_cycles[8];
  nonsequential_byte_half_cycles[0xf] = nonsequential_byte_half_cycles[8];
  sequential_byte_half_cycles[0xe] = nonsequential_byte_half_cycles[8];
  sequential_byte_half_cycles[0xf] = nonsequential_byte_half_cycles[8];
  nonsequential_word_cycles[0xe] = nonsequential_byte_half_cycles[8] * 2;
  sequential_word_cycles[0xe] = nonsequential_word_cycles[0xe];
  nonsequential_word_cycles[0xf] = nonsequential_word_cycles[0xe];
  sequential_word_cycles[0xf] = nonsequential_word_cycles[0xe];
  return;
}

Assistant:

void on_waitcnt_updated() {
    nonsequential_byte_half_cycles[REGION_GAMEPAK0_L] = nonsequential_waitstates(bus->WAITCNT.wait_state_0_nonsequential);
    nonsequential_byte_half_cycles[REGION_GAMEPAK0_H] = nonsequential_byte_half_cycles[REGION_GAMEPAK0_L];
    sequential_byte_half_cycles[REGION_GAMEPAK0_L] = bus->WAITCNT.wait_state_0_sequential ? 1 : 2;
    sequential_byte_half_cycles[REGION_GAMEPAK0_H] = bus->WAITCNT.wait_state_0_sequential ? 1 : 2;
    nonsequential_word_cycles[REGION_GAMEPAK0_L] = nonsequential_byte_half_cycles[REGION_GAMEPAK0_L] + sequential_byte_half_cycles[REGION_GAMEPAK0_L];
    sequential_word_cycles[REGION_GAMEPAK0_H] = sequential_byte_half_cycles[REGION_GAMEPAK0_L] * 2;

    nonsequential_byte_half_cycles[REGION_GAMEPAK1_L] = nonsequential_waitstates(bus->WAITCNT.wait_state_1_nonsequential);
    nonsequential_byte_half_cycles[REGION_GAMEPAK1_H] = nonsequential_byte_half_cycles[REGION_GAMEPAK1_L];
    sequential_byte_half_cycles[REGION_GAMEPAK1_L] = bus->WAITCNT.wait_state_1_sequential ? 1 : 4;
    sequential_byte_half_cycles[REGION_GAMEPAK1_H] = bus->WAITCNT.wait_state_1_sequential ? 1 : 4;
    nonsequential_word_cycles[REGION_GAMEPAK1_L] = nonsequential_byte_half_cycles[REGION_GAMEPAK1_L] + sequential_byte_half_cycles[REGION_GAMEPAK1_L];
    sequential_word_cycles[REGION_GAMEPAK1_H] = sequential_byte_half_cycles[REGION_GAMEPAK1_L] * 2;

    nonsequential_byte_half_cycles[REGION_GAMEPAK2_L] = nonsequential_waitstates(bus->WAITCNT.wait_state_2_nonsequential);
    nonsequential_byte_half_cycles[REGION_GAMEPAK2_H] = nonsequential_byte_half_cycles[REGION_GAMEPAK2_L];
    sequential_byte_half_cycles[REGION_GAMEPAK2_L] = bus->WAITCNT.wait_state_2_sequential ? 1 : 8;
    sequential_byte_half_cycles[REGION_GAMEPAK2_H] = bus->WAITCNT.wait_state_2_sequential ? 1 : 8;
    nonsequential_word_cycles[REGION_GAMEPAK2_L] = nonsequential_byte_half_cycles[REGION_GAMEPAK2_L] + sequential_byte_half_cycles[REGION_GAMEPAK2_L];
    sequential_word_cycles[REGION_GAMEPAK2_H] = sequential_byte_half_cycles[REGION_GAMEPAK2_L] * 2;

    nonsequential_byte_half_cycles[REGION_SRAM] = nonsequential_waitstates(bus->WAITCNT.sram_wait);
    nonsequential_byte_half_cycles[REGION_SRAM_MIRR] = nonsequential_byte_half_cycles[REGION_SRAM];
    sequential_byte_half_cycles[REGION_SRAM] = nonsequential_byte_half_cycles[REGION_SRAM];
    sequential_byte_half_cycles[REGION_SRAM_MIRR] = nonsequential_byte_half_cycles[REGION_SRAM];
    nonsequential_word_cycles[REGION_SRAM] = nonsequential_byte_half_cycles[REGION_SRAM] + sequential_byte_half_cycles[REGION_SRAM];
    sequential_word_cycles[REGION_SRAM] = sequential_byte_half_cycles[REGION_SRAM] + sequential_byte_half_cycles[REGION_SRAM];
    nonsequential_word_cycles[REGION_SRAM_MIRR] = nonsequential_word_cycles[REGION_SRAM];
    sequential_word_cycles[REGION_SRAM_MIRR] = sequential_word_cycles[REGION_SRAM];
}